

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void flatbuffers::anon_unknown_0::SingleValueRepack<short>(Value *e,short val)

{
  bool bVar1;
  string local_38;
  short local_12;
  Value *pVStack_10;
  short val_local;
  Value *e_local;
  
  local_12 = val;
  pVStack_10 = e;
  bVar1 = IsInteger((e->type).base_type);
  if (bVar1) {
    NumToString<short>(&local_38,local_12);
    std::__cxx11::string::operator=((string *)&pVStack_10->constant,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static inline void SingleValueRepack(Value &e, T val) {
  // Remove leading zeros.
  if (IsInteger(e.type.base_type)) { e.constant = NumToString(val); }
}